

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void undo_build_ssa(gen_ctx_t gen_ctx)

{
  uint uVar1;
  bb_t_conflict pbVar2;
  void *pvVar3;
  MIR_insn_t *ppMVar4;
  int iVar5;
  DLIST_bb_t *pDVar6;
  DLIST_bb_insn_t *pDVar7;
  ulong uVar8;
  MIR_op_t *pMVar9;
  void *__ptr;
  bb_insn_t pbVar10;
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  int local_74;
  bb_t_conflict local_70;
  MIR_insn_t local_68;
  bb_insn_t local_60;
  MIR_reg_t local_54;
  insn_var_iterator_t local_50;
  
  free_fake_bb_insns(gen_ctx->ssa_ctx->arg_bb_insns);
  free_fake_bb_insns(gen_ctx->ssa_ctx->undef_insns);
  pDVar6 = &gen_ctx->curr_cfg->bbs;
  while (pbVar2 = pDVar6->head, pbVar2 != (bb_t_conflict)0x0) {
    pDVar7 = &pbVar2->bb_insns;
    local_70 = pbVar2;
    while (pbVar10 = pDVar7->head, pbVar10 != (bb_insn_t)0x0) {
      local_68 = pbVar10->insn;
      pMVar9 = local_68->ops;
      local_50.nops = (size_t)*(uint *)&local_68->field_0x1c;
      local_50.op_num = 0;
      local_50.op_part_num = 0;
      local_60 = pbVar10;
      local_50.insn = local_68;
      while( true ) {
        iVar5 = output_insn_var_iterator_next(gen_ctx,&local_50,&local_54,&local_74);
        if (iVar5 == 0) break;
        __ptr = pMVar9[local_74].data;
        while (__ptr != (void *)0x0) {
          pvVar3 = *(void **)((long)__ptr + 0x20);
          free(__ptr);
          __ptr = pvVar3;
        }
      }
      uVar1 = *(uint *)&local_68->field_0x1c;
      for (uVar8 = 0; uVar8 < uVar1; uVar8 = uVar8 + 1) {
        pMVar9->data = (void *)0x0;
        pMVar9 = pMVar9 + 1;
      }
      pDVar7 = (DLIST_bb_insn_t *)&(local_60->bb_insn_link).next;
    }
    pDVar6 = (DLIST_bb_t *)&(local_70->bb_link).next;
  }
  pDVar6 = &gen_ctx->curr_cfg->bbs;
  while (pbVar2 = pDVar6->head, pbVar2 != (bb_t_conflict)0x0) {
    pbVar10 = (pbVar2->bb_insns).head;
    while (pbVar10 != (bb_insn_t)0x0) {
      ppMVar4 = &pbVar10->insn;
      pbVar10 = (pbVar10->bb_insn_link).next;
      if (*(int *)&(*ppMVar4)->field_0x18 == 0xba) {
        gen_delete_insn(gen_ctx,*ppMVar4);
      }
    }
    pDVar6 = (DLIST_bb_t *)&(pbVar2->bb_link).next;
  }
  return;
}

Assistant:

static void undo_build_ssa (gen_ctx_t gen_ctx) {
  bb_t bb;
  bb_insn_t bb_insn, next_bb_insn;
  ssa_edge_t se, next_se;
  int op_num;
  MIR_reg_t var;
  MIR_insn_t insn;
  insn_var_iterator_t iter;

  free_fake_bb_insns (arg_bb_insns);
  free_fake_bb_insns (undef_insns);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        /* all sse after ssa combine available only from defs */
        for (se = insn->ops[op_num].data; se != NULL; se = next_se) {
          next_se = se->next_use;
          free_ssa_edge (se);
        }
      }
      for (size_t i = 0; i < insn->nops; i++) insn->ops[i].data = NULL;
    }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
      next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
      if (bb_insn->insn->code == MIR_PHI) gen_delete_insn (gen_ctx, bb_insn->insn);
    }
}